

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Poly1305.c
# Opt level: O0

void EverCrypt_Poly1305_mac(uint8_t *output,uint8_t *input,uint32_t input_len,uint8_t *key)

{
  _Bool _Var1;
  _Bool _Var2;
  uint8_t *in_stack_000002f0;
  uint32_t in_stack_000002fc;
  uint8_t *in_stack_00000300;
  uint8_t *in_stack_00000308;
  _Bool vec128;
  _Bool vec256;
  uint8_t *key_local;
  uint32_t input_len_local;
  uint8_t *input_local;
  uint8_t *output_local;
  
  _Var1 = EverCrypt_AutoConfig2_has_vec256();
  _Var2 = EverCrypt_AutoConfig2_has_vec128();
  if (_Var1) {
    Hacl_MAC_Poly1305_Simd256_mac
              (in_stack_00000308,in_stack_00000300,in_stack_000002fc,in_stack_000002f0);
  }
  else if (_Var2) {
    Hacl_MAC_Poly1305_Simd128_mac(output,input,input_len,key);
  }
  else {
    poly1305_vale(output,input,input_len,key);
  }
  return;
}

Assistant:

void EverCrypt_Poly1305_mac(uint8_t *output, uint8_t *input, uint32_t input_len, uint8_t *key)
{
  bool vec256 = EverCrypt_AutoConfig2_has_vec256();
  bool vec128 = EverCrypt_AutoConfig2_has_vec128();
  #if HACL_CAN_COMPILE_VEC256
  if (vec256)
  {
    KRML_MAYBE_UNUSED_VAR(vec128);
    Hacl_MAC_Poly1305_Simd256_mac(output, input, input_len, key);
    return;
  }
  #endif
  #if HACL_CAN_COMPILE_VEC128
  if (vec128)
  {
    KRML_MAYBE_UNUSED_VAR(vec256);
    Hacl_MAC_Poly1305_Simd128_mac(output, input, input_len, key);
    return;
  }
  #endif
  KRML_MAYBE_UNUSED_VAR(vec256);
  KRML_MAYBE_UNUSED_VAR(vec128);
  #if HACL_CAN_COMPILE_VALE
  poly1305_vale(output, input, input_len, key);
  #else
  KRML_HOST_IGNORE(poly1305_vale);
  Hacl_MAC_Poly1305_mac(output, input, input_len, key);
  #endif
}